

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

action Search::single_prediction_LDF
                 (search_private *priv,example *ecs,size_t ec_cnt,int policy,float *a_cost,
                 action override_action)

{
  label *this;
  example *target;
  wclass **ppwVar1;
  action aVar2;
  size_t sVar3;
  uint64_t uVar4;
  action_cache *paVar5;
  BaseTask *pBVar6;
  uint uVar7;
  label_t lVar8;
  label_t lVar9;
  wclass *pwVar10;
  size_t sVar11;
  label_t lVar12;
  wclass *pwVar13;
  size_t sVar14;
  v_array<Search::action_cache> *this_00;
  float *pfVar15;
  bool bVar16;
  action aVar17;
  int iVar18;
  multi_learner *this_01;
  long lVar19;
  size_t i;
  ulong uVar20;
  uint uVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float local_100;
  action local_fc;
  v_array<Search::action_cache> *this_cache;
  int local_d4;
  action_cache local_d0;
  float *local_c0;
  multi_ex tmp;
  polylabel old_label;
  wclass wc;
  
  local_c0 = a_cost;
  bVar16 = need_memo_foreach_action(priv);
  bVar22 = true;
  if ((!bVar16) &&
     ((priv->metaoverride == (BaseTask *)0x0 ||
      (priv->metaoverride->_foreach_action ==
       (_func_void_search_ptr_size_t_float_action_bool_float *)0x0)))) {
    bVar22 = override_action != 0xffffffff;
  }
  this = &priv->ldf_test_label;
  (*(code *)COST_SENSITIVE::cs_label)(this);
  wc.x = 0.0;
  wc.class_index = 1;
  wc.partial_prediction = 0.0;
  wc.wap_value = 0.0;
  v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,&wc);
  if (priv->is_ldf == true) {
    bVar16 = COST_SENSITIVE::ec_is_example_header(ecs);
  }
  else {
    bVar16 = false;
  }
  this_cache = (v_array<Search::action_cache> *)0x0;
  if (bVar22) {
    this_cache = (v_array<Search::action_cache> *)operator_new(0x20);
    this_cache->_begin = (action_cache *)0x0;
    this_cache->_end = (action_cache *)0x0;
    this_cache->end_array = (action_cache *)0x0;
    this_cache->erase_count = 0;
  }
  this_00 = this_cache;
  iVar18 = 0;
  local_d4 = bVar16 - override_action;
  local_100 = 0.0;
  local_fc = 0;
  do {
    pfVar15 = local_c0;
    uVar7 = (uint)bVar16;
    uVar21 = uVar7 + iVar18;
    uVar20 = (ulong)uVar21;
    if (ec_cnt <= uVar20) {
      aVar17 = override_action;
      if (override_action == 0xffffffff) {
        *local_c0 = local_100;
        aVar17 = local_fc;
      }
      if (this_00 != (v_array<Search::action_cache> *)0x0) {
        lVar19 = 0xc;
        for (uVar20 = 0; paVar5 = this_00->_begin,
            uVar20 < (ulong)((long)this_00->_end - (long)paVar5 >> 4); uVar20 = uVar20 + 1) {
          fVar23 = *pfVar15;
          *(float *)((long)paVar5 + lVar19 + -0xc) = fVar23;
          aVar2 = *(action *)((long)paVar5 + lVar19 + -8);
          *(bool *)((long)paVar5 + lVar19 + -4) = aVar2 == aVar17;
          pBVar6 = priv->metaoverride;
          if ((pBVar6 != (BaseTask *)0x0) &&
             (pBVar6->_foreach_action != (_func_void_search_ptr_size_t_float_action_bool_float *)0x0
             )) {
            (*pBVar6->_foreach_action)
                      (pBVar6->sch,priv->t - 1,fVar23,aVar2,aVar2 == aVar17,
                       *(float *)((long)&paVar5->min_cost + lVar19));
          }
          lVar19 = lVar19 + 0x10;
        }
        bVar22 = need_memo_foreach_action(priv);
        if (override_action == 0xffffffff && bVar22) {
          v_array<v_array<Search::action_cache>_*>::push_back
                    (&priv->memo_foreach_action,&this_cache);
        }
        else {
          v_array<Search::action_cache>::delete_v(this_00);
          operator_delete(this_cache);
        }
      }
      priv->total_predictions_made = priv->total_predictions_made + 1;
      return aVar17;
    }
    if (uVar7 != 0) {
      LabelDict::add_example_namespaces_from_example(ecs + uVar20,ecs);
    }
    target = ecs + uVar20;
    sVar3 = ecs[uVar20].l.cb_eval.event.costs.erase_count;
    lVar8 = ecs[uVar20].l.multi;
    lVar9 = (&ecs[uVar20].l.multi)[1];
    ppwVar1 = &ecs[uVar20].l.cs.costs.end_array;
    pwVar10 = *ppwVar1;
    sVar11 = (size_t)ppwVar1[1];
    lVar12 = (label_t)(priv->ldf_test_label).costs._end;
    pwVar13 = (priv->ldf_test_label).costs.end_array;
    sVar14 = (priv->ldf_test_label).costs.erase_count;
    ecs[uVar20].l.multi = (label_t)(this->costs)._begin;
    (&ecs[uVar20].l.multi)[1] = lVar12;
    ppwVar1 = &ecs[uVar20].l.cs.costs.end_array;
    *ppwVar1 = pwVar13;
    ppwVar1[1] = (wclass *)sVar14;
    tmp.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    tmp.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    tmp.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    uVar4 = ecs[uVar20].super_example_predict.ft_offset;
    ecs[uVar20].super_example_predict.ft_offset = priv->offset;
    local_d0._0_8_ = target;
    std::vector<example*,std::allocator<example*>>::emplace_back<example*>
              ((vector<example*,std::allocator<example*>> *)&tmp,(example **)&local_d0);
    this_01 = LEARNER::as_multiline<char,char>(priv->base_learner);
    LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::predict
              (this_01,&tmp,(long)policy);
    (target->super_example_predict).ft_offset = uVar4;
    if (override_action == 0xffffffff) {
      fVar23 = target->partial_prediction;
      fVar24 = fVar23;
      aVar17 = uVar21;
      if ((iVar18 == 0) || (fVar23 < local_100)) goto LAB_00215a70;
    }
    else if (local_d4 + iVar18 == 0) {
      fVar23 = target->partial_prediction;
      fVar24 = local_100;
      aVar17 = local_fc;
LAB_00215a70:
      *local_c0 = fVar23;
      local_100 = fVar24;
      local_fc = aVar17;
    }
    if (this_00 != (v_array<Search::action_cache> *)0x0) {
      local_d0.cost = target->partial_prediction;
      local_d0._0_8_ = (ulong)uVar21 << 0x20;
      local_d0.is_opt = false;
      v_array<Search::action_cache>::push_back(this_00,&local_d0);
    }
    priv->num_features = priv->num_features + target->num_features;
    ecs[uVar20].l.cb_eval.event.costs.erase_count = sVar3;
    ecs[uVar20].l.cs.costs.end_array = pwVar10;
    ecs[uVar20].l.cs.costs.erase_count = sVar11;
    ecs[uVar20].l.multi = lVar8;
    ecs[uVar20].l.cs.costs._end = (wclass *)lVar9;
    if (uVar7 != 0) {
      LabelDict::del_example_namespaces_from_example(target,ecs);
    }
    std::_Vector_base<example_*,_std::allocator<example_*>_>::~_Vector_base
              (&tmp.super__Vector_base<example_*,_std::allocator<example_*>_>);
    iVar18 = iVar18 + 1;
  } while( true );
}

Assistant:

action single_prediction_LDF(search_private& priv, example* ecs, size_t ec_cnt, int policy, float& a_cost,
    action override_action)  // if override_action != -1, then we return it as the action and a_cost is set to the
                             // appropriate cost for that action
{
  bool need_partial_predictions = need_memo_foreach_action(priv) ||
      (priv.metaoverride && priv.metaoverride->_foreach_action) || (override_action != (action)-1);

  CS::cs_label.default_label(&priv.ldf_test_label);
  CS::wclass wc = {0., 1, 0., 0.};
  priv.ldf_test_label.costs.push_back(wc);

  // keep track of best (aka chosen) action
  float best_prediction = 0.;
  action best_action = 0;

  size_t start_K = (priv.is_ldf && COST_SENSITIVE::ec_is_example_header(ecs[0])) ? 1 : 0;

  v_array<action_cache>* this_cache = nullptr;
  if (need_partial_predictions)
  {
    this_cache = new v_array<action_cache>();
    *this_cache = v_init<action_cache>();
  }

  for (action a = (uint32_t)start_K; a < ec_cnt; a++)
  {
    cdbg << "== single_prediction_LDF a=" << a << "==" << endl;
    if (start_K > 0)
      LabelDict::add_example_namespaces_from_example(ecs[a], ecs[0]);

    polylabel old_label = ecs[a].l;
    ecs[a].l.cs = priv.ldf_test_label;

    multi_ex tmp;
    uint64_t old_offset = ecs[a].ft_offset;
    ecs[a].ft_offset = priv.offset;
    tmp.push_back(&ecs[a]);
    as_multiline(priv.base_learner)->predict(tmp, policy);

    ecs[a].ft_offset = old_offset;
    cdbg << "partial_prediction[" << a << "] = " << ecs[a].partial_prediction << endl;

    if (override_action != (action)-1)
    {
      if (a == override_action)
        a_cost = ecs[a].partial_prediction;
    }
    else if ((a == start_K) || (ecs[a].partial_prediction < best_prediction))
    {
      best_prediction = ecs[a].partial_prediction;
      best_action = a;
      a_cost = best_prediction;
    }
    if (this_cache)
      this_cache->push_back(action_cache(0., a, false, ecs[a].partial_prediction));

    priv.num_features += ecs[a].num_features;
    ecs[a].l = old_label;
    if (start_K > 0)
      LabelDict::del_example_namespaces_from_example(ecs[a], ecs[0]);
  }
  if (override_action != (action)-1)
    best_action = override_action;
  else
    a_cost = best_prediction;

  if (this_cache)
  {
    for (size_t i = 0; i < this_cache->size(); i++)
    {
      action_cache& ac = (*this_cache)[i];
      ac.min_cost = a_cost;
      ac.is_opt = (ac.k == best_action);
      if (priv.metaoverride && priv.metaoverride->_foreach_action)
        priv.metaoverride->_foreach_action(*priv.metaoverride->sch, priv.t - 1, ac.min_cost, ac.k, ac.is_opt, ac.cost);
    }
    if (need_memo_foreach_action(priv) && (override_action == (action)-1))
      priv.memo_foreach_action.push_back(this_cache);
    else
    {
      this_cache->delete_v();
      delete this_cache;
    }
  }

  // TODO: generate raw predictions if necessary

  priv.total_predictions_made++;
  return best_action;
}